

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::TermSpec::isFinal(TermSpec *this)

{
  Term *this_00;
  uint uVar1;
  
  this_00 = (Term *)(this->t)._content;
  if (this->q == true) {
    if (((ulong)this_00 & 3) == 0) {
      uVar1 = Kernel::Term::numVarOccs(this_00);
      return uVar1 == 0;
    }
  }
  else {
    if (((uint)this_00 & 3) == 1) {
      return true;
    }
    if (((ulong)this_00 & 3) == 0) {
      return (bool)(((byte)this_00->_args[0]._content & 8) >> 3);
    }
  }
  return false;
}

Assistant:

bool isFinal()
        {
          //the fact that a term is shared means it does not contain any special variables
          return q
        ? (t.isTerm() && t.term()->ground())
        : (t.isOrdinaryVar() || (t.isTerm() && t.term()->shared()) );
        }